

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetFunctionContextVariableName(ExpressionContext *ctx,FunctionData *function,uint index)

{
  InplaceStr *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint value;
  undefined4 extraout_var;
  char *pcVar6;
  size_t sVar7;
  char *__dest;
  char *pos;
  char *name;
  uint nameLength;
  undefined1 local_50 [8];
  InplaceStr operatorName;
  InplaceStr functionName;
  uint index_local;
  FunctionData *function_local;
  ExpressionContext *ctx_local;
  char *__s;
  
  pIVar1 = &function->name->name;
  operatorName.end = pIVar1->begin;
  if ((((*operatorName.end < 'A') && (*operatorName.end != '$')) || (*operatorName.end == '|')) ||
     ((*operatorName.end == '^' || (*operatorName.end == '~')))) {
    _local_50 = GetOperatorName(*pIVar1);
    bVar2 = InplaceStr::empty((InplaceStr *)local_50);
    if (!bVar2) {
      operatorName.end = (char *)local_50;
    }
  }
  uVar3 = InplaceStr::length((InplaceStr *)&operatorName.end);
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar3 + 0x21));
  pcVar6 = operatorName.end;
  __s = (char *)CONCAT44(extraout_var,iVar4);
  __dest = __s + 1;
  *__s = '$';
  uVar5 = InplaceStr::length((InplaceStr *)&operatorName.end);
  memcpy(__dest,pcVar6,(ulong)uVar5);
  uVar5 = InplaceStr::length((InplaceStr *)&operatorName.end);
  __dest[uVar5] = '_';
  value = InplaceStr::hash(&(function->type->super_TypeBase).name);
  pcVar6 = NameWriteUnsigned(__dest + uVar5 + 1,value);
  *pcVar6 = '_';
  pcVar6 = NameWriteUnsigned(pcVar6 + 1,index);
  strcpy(pcVar6,"_ext");
  pcVar6[4] = '\0';
  sVar7 = strlen(__s);
  if (uVar3 + 0x21 <= sVar7) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x1b3,
                  "InplaceStr GetFunctionContextVariableName(ExpressionContext &, FunctionData *, unsigned int)"
                 );
  }
  InplaceStr::InplaceStr((InplaceStr *)&ctx_local,__s);
  return _ctx_local;
}

Assistant:

InplaceStr GetFunctionContextVariableName(ExpressionContext &ctx, FunctionData *function, unsigned index)
{
	InplaceStr functionName = function->name->name;

	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + 32 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '$';

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, function->type->name.hash());

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, index);

	strcpy(pos, "_ext");
	pos += strlen("_ext");

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}